

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpk.c
# Opt level: O2

XPK * XPK_NewFromFile(FILE *f,LPStatus *status)

{
  _Bool _Var1;
  uint32_t uVar2;
  LPStatus LVar3;
  XPK *pXVar4;
  XPKEntry **ppXVar5;
  XPKEntry *pXVar6;
  long lVar7;
  uint32_t *puVar8;
  int i;
  ulong uVar9;
  ushort uVar10;
  uint16_t y;
  uint16_t x;
  uint16_t height;
  uint16_t width;
  uint32_t offset;
  LPStatus *local_38;
  
  _Var1 = ValidateMagicF(f,XPK_MAGIC,4);
  local_38 = status;
  if (_Var1) {
    pXVar4 = (XPK *)malloc(0x30);
    if (pXVar4 != (XPK *)0x0) {
      pXVar4->clu = (CLU *)0x0;
      pXVar4->file = f;
      ReadUint8(f,2,pXVar4->co2);
      ReadUint16(f,1,&pXVar4->n_entries);
      pXVar4->a = 0;
      fseek((FILE *)f,4,1);
      ReadUint32(f,1,&pXVar4->next_section);
      uVar10 = pXVar4->n_entries;
      ppXVar5 = (XPKEntry **)calloc((ulong)uVar10,0x20);
      pXVar4->entries = ppXVar5;
      for (uVar9 = 0; uVar9 < uVar10; uVar9 = uVar9 + 1) {
        fseek((FILE *)f,8,1);
        ReadUint16(f,1,&x);
        ReadUint16(f,1,&y);
        ReadUint16(f,1,&width);
        ReadUint16(f,1,&height);
        pXVar6 = XPKEntry_New((ulong)width,(ulong)height,(uint)x,(uint)y);
        pXVar6->xpk = pXVar4;
        pXVar4->entries[uVar9] = pXVar6;
        uVar10 = pXVar4->n_entries;
      }
      lVar7 = ftell((FILE *)f);
      uVar10 = pXVar4->n_entries;
      puVar8 = (uint32_t *)calloc((ulong)uVar10,4);
      pXVar4->offsets = puVar8;
      for (uVar9 = 0; uVar9 < uVar10; uVar9 = uVar9 + 1) {
        ReadUint32(f,1,&offset);
        uVar2 = offset + (int)lVar7;
        pXVar4->offsets[uVar9] = uVar2;
        pXVar4->entries[uVar9]->offset = uVar2;
        uVar10 = pXVar4->n_entries;
      }
      LVar3 = LUNAPURPURA_OK;
      goto LAB_00102a38;
    }
    LVar3 = LUNAPURPURA_ERROR;
  }
  else {
    LVar3 = LUNAPURPURA_BADMAGIC;
  }
  pXVar4 = (XPK *)0x0;
LAB_00102a38:
  *local_38 = LVar3;
  return pXVar4;
}

Assistant:

XPK *
XPK_NewFromFile(FILE *f, LPStatus *status)
{
	if (!ValidateMagicF(f, XPK_MAGIC, XPK_MAGIC_LEN)) {
		*status = LUNAPURPURA_BADMAGIC;
		return NULL;
	}

	XPK *xpk = malloc(sizeof(XPK));

	/* XXX should explain bad malloc */
	if (!xpk) {
		free(xpk);
		*status = LUNAPURPURA_ERROR;
		return NULL;
	}

	xpk->clu = NULL;
	xpk->file = f;

	ReadUint8(f, 2, xpk->co2);
	ReadUint16(f, 1, &xpk->n_entries);
	xpk->a = 0; /* XXX dunno */
	fseek(f, 4L, SEEK_CUR);
	ReadUint32(f, 1, &xpk->next_section);

	xpk->entries = calloc(xpk->n_entries, sizeof(XPKEntry));

	for (int i = 0; i < xpk->n_entries; i++) {
		uint16_t width;
		uint16_t height;
		uint16_t x;
		uint16_t y;

		fseek(f, 8L, SEEK_CUR); /* Ignore first 4 numbers ("x1", "x2", "w1", "w2") */
		ReadUint16(f, 1, &x);
		ReadUint16(f, 1, &y);
		ReadUint16(f, 1, &width);
		ReadUint16(f, 1, &height);

		XPKEntry *entry = XPKEntry_New(width, height, x, y);
		entry->xpk = xpk;

		if (!entry) {
			*status = LUNAPURPURA_ERROR;
			fclose(f);
			return NULL;
		}

		xpk->entries[i] = entry;
	}

	/*
	 * The offsets which are listed in the XPK file are not absolute, they are
	 * relative to this position right here. But we'll go ahead and store the
	 * absolute offsets in the XPK struct we're trying to create. (Nothing
	 * wrong with that, right?)
	 *
	 * While generating this list, we'll enrich each of the XPKEntries we
	 * created earlier with this new info.
	 */
	uint32_t offsets_start_pos = ftell(f);

	/* XXX check for malloc error */
	xpk->offsets = calloc(xpk->n_entries, sizeof(uint32_t));

	for (int i = 0; i < xpk->n_entries; i++) {
		uint32_t offset;
		ReadUint32(f, 1, &offset);
		uint32_t absolute_offset = offsets_start_pos + offset;
		xpk->offsets[i] = absolute_offset;
		xpk->entries[i]->offset = absolute_offset;
	}

	*status = LUNAPURPURA_OK;
	return xpk;
}